

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

void sx_strpool_destroy(sx_strpool *sp,sx_alloc *alloc)

{
  code *pcVar1;
  sx_alloc *alloc_local;
  sx_strpool *sp_local;
  
  if (sp == (sx_strpool *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",
                      0x308,"sp");
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  strpool_term(sp);
  sx__free(alloc,sp,0,(char *)0x0,(char *)0x0,0);
  return;
}

Assistant:

void sx_strpool_destroy(sx_strpool* sp, const sx_alloc* alloc)
{
    sx_assert(sp);
    strpool_term(sp);
    sx_free(alloc, sp);
}